

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

App * __thiscall CLI::Option_group::add_subcommand(Option_group *this,App *subcom)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  App *pAVar2;
  element_type *this_00;
  shared_ptr<CLI::App> local_48 [2];
  undefined1 local_28 [8];
  App_p subc;
  App *subcom_local;
  Option_group *this_local;
  
  subc.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)subcom;
  pAVar2 = App::get_parent(subcom);
  App::get_subcommand_ptr((App *)local_28,pAVar2);
  this_00 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_28);
  pAVar2 = App::get_parent(this_00);
  App::remove_subcommand
            (pAVar2,(App *)subc.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi);
  std::shared_ptr<CLI::App>::shared_ptr(local_48,(shared_ptr<CLI::App> *)local_28);
  App::add_subcommand(&this->super_App,local_48);
  std::shared_ptr<CLI::App>::~shared_ptr(local_48);
  _Var1 = subc.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)local_28);
  return (App *)_Var1._M_pi;
}

Assistant:

App *add_subcommand(App *subcom) {
        App_p subc = subcom->get_parent()->get_subcommand_ptr(subcom);
        subc->get_parent()->remove_subcommand(subcom);
        add_subcommand(std::move(subc));
        return subcom;
    }